

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O3

void lore_append_spells(textblock *tb,monster_race *race,monster_lore *lore,bitflag *known_flags)

{
  _Bool know_hp;
  undefined8 uVar1;
  _Bool _Var2;
  _Bool _Var3;
  monster_sex_t mVar4;
  uint uVar5;
  ulong uVar6;
  char *in_R8;
  char *conjunction;
  char *in_R9;
  bitflag *flags2;
  bitflag current_flags [12];
  bitflag test_flags [12];
  bitflag local_5c [12];
  bitflag *local_50;
  monster_race *local_48;
  bitflag local_3c [12];
  
  local_50 = known_flags;
  if (((tb == (textblock *)0x0) || (race == (monster_race *)0x0)) || (lore == (monster_lore *)0x0))
  {
    __assert_fail("tb && race && lore",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-lore.c"
                  ,0x5df,
                  "void lore_append_spells(textblock *, const struct monster_race *, const struct monster_lore *, bitflag *)"
                 );
  }
  local_48 = ref_race;
  know_hp = lore->armour_known;
  ref_race = race;
  mVar4 = lore_monster_sex(race);
  uVar1 = *(undefined8 *)(lore_pronoun_nominative_lore_pronouns + (ulong)mVar4 * 0x10 + 8);
  create_mon_spell_mask(local_5c,0x800,0);
  flags2 = lore->spell_flags;
  flag_inter(local_5c,flags2,0xc);
  create_mon_spell_mask(local_3c,4,0);
  flag_diff(local_5c,local_3c,0xc);
  _Var2 = flag_is_empty(local_5c,0xc);
  if (!_Var2) {
    textblock_append(tb,"%s may ",uVar1);
    lore_append_spell_clause(tb,local_5c,know_hp,race,in_R8,in_R9);
  }
  create_mon_spell_mask(local_5c,4,0);
  flag_inter(local_5c,flags2,0xc);
  _Var3 = flag_is_empty(local_5c,0xc);
  if (_Var3) {
    if (!_Var2) goto LAB_0016f2f0;
  }
  else {
    if (_Var2) {
      textblock_append(tb,"%s may ",uVar1);
    }
    else {
      textblock_append(tb,", and may ");
    }
    textblock_append_c(tb,'\f',"breathe ");
    lore_append_spell_clause(tb,local_5c,know_hp,race,in_R8,in_R9);
LAB_0016f2f0:
    if (race->freq_innate != L'\0') {
      if (lore->innate_freq_known == true) {
        textblock_append(tb,"; ");
        textblock_append_c(tb,'\r',"1");
        textblock_append(tb," time in ");
        uVar5 = (uint)(100 / (long)race->freq_innate);
LAB_0016f3c5:
        textblock_append_c(tb,'\r',"%d",(ulong)uVar5);
      }
      else if (lore->cast_innate != '\0') {
        uVar5 = ((race->freq_innate + L'\t') / 10) * 10;
        uVar6 = 1;
        if (1 < (int)uVar5) {
          uVar6 = (ulong)uVar5;
        }
        textblock_append(tb,"; about ");
        textblock_append_c(tb,'\r',"1");
        textblock_append(tb," time in ");
        uVar5 = (uint)(100 / uVar6);
        goto LAB_0016f3c5;
      }
      textblock_append(tb,".  ");
    }
  }
  flag_copy(local_5c,flags2,0xc);
  create_mon_spell_mask(local_3c,4,0x800,0);
  flag_diff(local_5c,local_3c,0xc);
  _Var2 = flag_is_empty(local_5c,0xc);
  if (_Var2) {
    ref_race = local_48;
    return;
  }
  textblock_append(tb,"%s may ",uVar1);
  textblock_append_c(tb,'\f',"cast spells");
  conjunction = "RF_SMART";
  _Var2 = flag_has_dbg(local_50,0xb,0x1a,"known_flags","RF_SMART");
  if (_Var2) {
    textblock_append(tb," intelligently");
  }
  textblock_append(tb," which ");
  lore_append_spell_clause(tb,local_5c,know_hp,race,conjunction,in_R9);
  if (race->freq_spell != L'\0') {
    if (lore->spell_freq_known == true) {
      textblock_append(tb,"; ");
      textblock_append_c(tb,'\r',"1");
      textblock_append(tb," time in ");
      uVar5 = (uint)(100 / (long)race->freq_spell);
    }
    else {
      if (lore->cast_spell == '\0') goto LAB_0016f5b1;
      uVar5 = ((race->freq_spell + L'\t') / 10) * 10;
      uVar6 = 1;
      if (1 < (int)uVar5) {
        uVar6 = (ulong)uVar5;
      }
      textblock_append(tb,"; about ");
      textblock_append_c(tb,'\r',"1");
      textblock_append(tb," time in ");
      uVar5 = (uint)(100 / uVar6);
    }
    textblock_append_c(tb,'\r',"%d",(ulong)uVar5);
  }
LAB_0016f5b1:
  textblock_append(tb,".  ");
  ref_race = local_48;
  return;
}

Assistant:

void lore_append_spells(textblock *tb, const struct monster_race *race,
						const struct monster_lore *lore,
						bitflag known_flags[RF_SIZE])
{
	monster_sex_t msex = MON_SEX_NEUTER;
	bool innate = false;
	bool breath = false;
	const char *initial_pronoun;
	bool know_hp;
	bitflag current_flags[RSF_SIZE], test_flags[RSF_SIZE];
	const struct monster_race *old_ref;

	assert(tb && race && lore);

	/* Set the race for expressions in the spells. */
	old_ref = ref_race;
	ref_race = race;

	know_hp = lore->armour_known;

	/* Extract a gender (if applicable) and get a pronoun for the start of
	 * sentences */
	msex = lore_monster_sex(race);
	initial_pronoun = lore_pronoun_nominative(msex, true);

	/* Collect innate (non-breath) attacks */
	create_mon_spell_mask(current_flags, RST_INNATE, RST_NONE);
	rsf_inter(current_flags, lore->spell_flags);
	create_mon_spell_mask(test_flags, RST_BREATH, RST_NONE);
	rsf_diff(current_flags, test_flags);
	if (!rsf_is_empty(current_flags)) {
		textblock_append(tb, "%s may ", initial_pronoun);
		lore_append_spell_clause(tb, current_flags, know_hp, race, "or", "");
		innate = true;
	}

	/* Collect breaths */
	create_mon_spell_mask(current_flags, RST_BREATH, RST_NONE);
	rsf_inter(current_flags, lore->spell_flags);
	if (!rsf_is_empty(current_flags)) {
		if (innate) {
			textblock_append(tb, ", and may ");
		} else {
			textblock_append(tb, "%s may ", initial_pronoun);
		}
		textblock_append_c(tb, COLOUR_L_RED, "breathe ");
		lore_append_spell_clause(tb, current_flags, know_hp, race, "or", "");
		breath = true;
	}

	/* End the sentence about innate spells and breaths */
	if ((innate || breath) && race->freq_innate) {
		if (lore->innate_freq_known) {
			/* Describe the spell frequency */
			textblock_append(tb, "; ");
			textblock_append_c(tb, COLOUR_L_GREEN, "1");
			textblock_append(tb, " time in ");
			textblock_append_c(tb, COLOUR_L_GREEN, "%d",
							   100 / race->freq_innate);
		} else if (lore->cast_innate) {
			/* Guess at the frequency */
			int approx_frequency = MAX(((race->freq_innate + 9) / 10) * 10, 1);
			textblock_append(tb, "; about ");
			textblock_append_c(tb, COLOUR_L_GREEN, "1");
			textblock_append(tb, " time in ");
			textblock_append_c(tb, COLOUR_L_GREEN, "%d",
							   100 / approx_frequency);
		}

		textblock_append(tb, ".  ");
	}

	/* Collect spell information */
	rsf_copy(current_flags, lore->spell_flags);
	create_mon_spell_mask(test_flags, RST_BREATH, RST_INNATE, RST_NONE);
	rsf_diff(current_flags, test_flags);
	if (!rsf_is_empty(current_flags)) {
		/* Intro */
		textblock_append(tb, "%s may ", initial_pronoun);

		/* Verb Phrase */
		textblock_append_c(tb, COLOUR_L_RED, "cast spells");

		/* Adverb */
		if (rf_has(known_flags, RF_SMART))
			textblock_append(tb, " intelligently");

		/* List */
		textblock_append(tb, " which ");
		lore_append_spell_clause(tb, current_flags, know_hp, race, "or", "");

		/* End the sentence about innate/other spells */
		if (race->freq_spell) {
			if (lore->spell_freq_known) {
				/* Describe the spell frequency */
				textblock_append(tb, "; ");
				textblock_append_c(tb, COLOUR_L_GREEN, "1");
				textblock_append(tb, " time in ");
				textblock_append_c(tb, COLOUR_L_GREEN, "%d",
								   100 / race->freq_spell);
			} else if (lore->cast_spell) {
				/* Guess at the frequency */
				int approx_frequency = MAX(((race->freq_spell + 9) / 10) * 10,
										   1);
				textblock_append(tb, "; about ");
				textblock_append_c(tb, COLOUR_L_GREEN, "1");
				textblock_append(tb, " time in ");
				textblock_append_c(tb, COLOUR_L_GREEN, "%d",
								   100 / approx_frequency);
			}
		}

		textblock_append(tb, ".  ");
	}

	/* Restore the previous reference. */
	ref_race = old_ref;
}